

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

int SetFrame(int frame_num,WebPIterator *iter)

{
  WebPDemuxer *dmux_00;
  WebPIterator *iter_00;
  Frame *in_RSI;
  int in_EDI;
  WebPDemuxer *dmux;
  Frame *frame;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  dmux_00 = (WebPDemuxer *)in_RSI->next_;
  if ((dmux_00 == (WebPDemuxer *)0x0) || (in_EDI < 0)) {
    iVar1 = 0;
  }
  else if (dmux_00->num_frames_ < in_EDI) {
    iVar1 = 0;
  }
  else {
    if (in_EDI == 0) {
      in_EDI = dmux_00->num_frames_;
    }
    iter_00 = (WebPIterator *)GetFrame(dmux_00,in_EDI);
    if (iter_00 == (WebPIterator *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = SynthesizeFrame((WebPDemuxer *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),in_RSI,
                              iter_00);
    }
  }
  return iVar1;
}

Assistant:

static int SetFrame(int frame_num, WebPIterator* const iter) {
  const Frame* frame;
  const WebPDemuxer* const dmux = (WebPDemuxer*)iter->private_;
  if (dmux == NULL || frame_num < 0) return 0;
  if (frame_num > dmux->num_frames_) return 0;
  if (frame_num == 0) frame_num = dmux->num_frames_;

  frame = GetFrame(dmux, frame_num);
  if (frame == NULL) return 0;

  return SynthesizeFrame(dmux, frame, iter);
}